

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doJSONObjects(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  int version;
  qpdf_stream_decode_level_e decode_level;
  qpdf_json_stream_data_e json_stream_data;
  QPDF *pQVar1;
  QPDF *first_key;
  bool *pbVar2;
  bool bVar3;
  element_type *peVar4;
  size_type sVar5;
  size_type sVar6;
  reference pQVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  QPDFObjGen local_250;
  QPDFObjGen og;
  iterator __end2_1;
  iterator __begin2_1;
  set *__range2_1;
  allocator<char> local_1e9;
  value_type local_1e8;
  allocator<char> local_1c1;
  key_type local_1c0;
  undefined1 local_1a0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  json_objects;
  allocator<char> local_159;
  string local_158;
  byte local_133;
  byte local_132;
  allocator<char> local_131;
  key_type local_130;
  string local_110;
  QPDFObjGen local_f0;
  undefined1 local_e8 [8];
  string key;
  QPDFObjectHandle *obj;
  iterator __end2;
  iterator __begin2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2;
  set wanted_og;
  bool all_objects;
  bool first_object;
  allocator<char> local_49;
  string local_48;
  QPDF *local_28;
  QPDF *pdf_local;
  bool *first_local;
  Pipeline *p_local;
  QPDFJob *this_local;
  
  local_28 = pdf;
  pdf_local = (QPDF *)first;
  first_local = (bool *)p;
  p_local = (Pipeline *)this;
  peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pbVar2 = first_local;
  pQVar1 = pdf_local;
  if (peVar4->json_version == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"objects",&local_49);
    JSON::writeDictionaryKey((Pipeline *)pbVar2,(bool *)pQVar1,&local_48,1);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_node_count._3_1_ = 1;
    JSON::writeDictionaryOpen
              ((Pipeline *)first_local,
               (bool *)((long)&wanted_og.
                               super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                               ._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),1);
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_node_count._2_1_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::empty(&peVar4->json_objects);
    getWantedJSONObjects((set *)&__range2,this);
    QPDF::getAllObjects((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2,
                        local_28);
    __end2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
    obj = (QPDFObjectHandle *)
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&obj), bVar3) {
      key.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
           ::operator*(&__end2);
      QPDFObjectHandle::unparse_abi_cxx11_((string *)local_e8,(QPDFObjectHandle *)key.field_2._8_8_)
      ;
      bVar3 = true;
      if ((wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
           _M_impl.super__Rb_tree_header._M_node_count._2_1_ & 1) == 0) {
        local_f0 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)key.field_2._8_8_);
        sVar5 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                          ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                           &__range2,&local_f0);
        bVar3 = sVar5 != 0;
      }
      pbVar2 = first_local;
      if (bVar3) {
        QPDFObjectHandle::unparse_abi_cxx11_(&local_110,(QPDFObjectHandle *)key.field_2._8_8_);
        JSON::writeDictionaryKey
                  ((Pipeline *)pbVar2,
                   (bool *)((long)&wanted_og.
                                   super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                   ._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),&local_110
                   ,2);
        std::__cxx11::string::~string((string *)&local_110);
        QPDFObjectHandle::writeJSON
                  ((QPDFObjectHandle *)key.field_2._8_8_,1,(Pipeline *)first_local,true,2);
        wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
        _M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_e8);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
    local_132 = 0;
    local_133 = 0;
    bVar3 = true;
    if ((wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
         _M_impl.super__Rb_tree_header._M_node_count._2_1_ & 1) == 0) {
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::allocator<char>::allocator();
      local_132 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"trailer",&local_131);
      local_133 = 1;
      sVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&peVar4->json_objects,&local_130);
      bVar3 = sVar6 != 0;
    }
    if ((local_133 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_130);
    }
    if ((local_132 & 1) != 0) {
      std::allocator<char>::~allocator(&local_131);
    }
    pbVar2 = first_local;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"trailer",&local_159);
      JSON::writeDictionaryKey
                ((Pipeline *)pbVar2,
                 (bool *)((long)&wanted_og.
                                 super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                 ._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),&local_158,2
                );
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
      QPDF::getTrailer((QPDF *)&json_objects._M_t._M_impl.super__Rb_tree_header._M_node_count);
      QPDFObjectHandle::writeJSON
                ((QPDFObjectHandle *)&json_objects._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 1,(Pipeline *)first_local,true,2);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)&json_objects._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
      _M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
    }
    JSON::writeDictionaryClose
              ((Pipeline *)first_local,
               (bool)(wanted_og.
                      super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t
                      ._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1),1);
    QPDFObjGen::set::~set((set *)&__range2);
  }
  else {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1a0);
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"trailer",&local_1c1);
    sVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&peVar4->json_objects,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    if (sVar6 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"trailer",&local_1e9);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1a0,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
    }
    getWantedJSONObjects((set *)&__begin2_1,this);
    __end2_1 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::begin
                         ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                          &__begin2_1);
    og = (QPDFObjGen)
         std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::end
                   ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                    &__begin2_1);
    while (bVar3 = std::operator!=(&__end2_1,(_Self *)&og), bVar3) {
      pQVar7 = std::_Rb_tree_const_iterator<QPDFObjGen>::operator*(&__end2_1);
      local_250 = *pQVar7;
      QPDFObjGen::unparse_abi_cxx11_(&local_2b0,&local_250,' ');
      std::operator+(&local_290,"obj:",&local_2b0);
      std::operator+(&local_270,&local_290," R");
      pVar8 = std::
              set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<std::__cxx11::string>
                        ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_1a0,&local_270);
      local_2c0 = (_Base_ptr)pVar8.first._M_node;
      local_2b8 = pVar8.second;
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::_Rb_tree_const_iterator<QPDFObjGen>::operator++(&__end2_1);
    }
    QPDFObjGen::set::~set((set *)&__begin2_1);
    pQVar1 = local_28;
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pbVar2 = first_local;
    first_key = pdf_local;
    version = peVar4->json_version;
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    decode_level = peVar4->decode_level;
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    json_stream_data = peVar4->json_stream_data;
    peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_2f0,
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1a0);
    QPDF::writeJSON(pQVar1,version,(Pipeline *)pbVar2,false,(bool *)first_key,decode_level,
                    json_stream_data,&peVar4->json_stream_prefix,&local_2f0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_2f0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1a0);
  }
  return;
}

Assistant:

void
QPDFJob::doJSONObjects(Pipeline* p, bool& first, QPDF& pdf)
{
    if (m->json_version == 1) {
        JSON::writeDictionaryKey(p, first, "objects", 1);
        bool first_object = true;
        JSON::writeDictionaryOpen(p, first_object, 1);
        bool all_objects = m->json_objects.empty();
        auto wanted_og = getWantedJSONObjects();
        for (auto& obj: pdf.getAllObjects()) {
            std::string key = obj.unparse();

            if (all_objects || wanted_og.count(obj.getObjGen())) {
                JSON::writeDictionaryKey(p, first_object, obj.unparse(), 2);
                obj.writeJSON(1, p, true, 2);
                first_object = false;
            }
        }
        if (all_objects || m->json_objects.count("trailer")) {
            JSON::writeDictionaryKey(p, first_object, "trailer", 2);
            pdf.getTrailer().writeJSON(1, p, true, 2);
            first_object = false;
        }
        JSON::writeDictionaryClose(p, first_object, 1);
    } else {
        std::set<std::string> json_objects;
        if (m->json_objects.count("trailer")) {
            json_objects.insert("trailer");
        }
        for (auto og: getWantedJSONObjects()) {
            json_objects.emplace("obj:" + og.unparse(' ') + " R");
        }
        pdf.writeJSON(
            m->json_version,
            p,
            false,
            first,
            m->decode_level,
            m->json_stream_data,
            m->json_stream_prefix,
            json_objects);
    }
}